

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# clipboard.c
# Opt level: O0

char * al_get_clipboard_text(ALLEGRO_DISPLAY *display)

{
  ALLEGRO_DISPLAY *in_RDI;
  ALLEGRO_DISPLAY *local_10;
  char *local_8;
  
  local_10 = in_RDI;
  if (in_RDI == (ALLEGRO_DISPLAY *)0x0) {
    local_10 = al_get_current_display();
  }
  if (local_10 == (ALLEGRO_DISPLAY *)0x0) {
    local_8 = (char *)0x0;
  }
  else if (local_10->vt->get_clipboard_text == (_func_char_ptr_ALLEGRO_DISPLAY_ptr *)0x0) {
    local_8 = (char *)0x0;
  }
  else {
    local_8 = (*local_10->vt->get_clipboard_text)(local_10);
  }
  return local_8;
}

Assistant:

char *al_get_clipboard_text(ALLEGRO_DISPLAY *display)
{
   if (!display)
      display = al_get_current_display();

   if (!display)
      return NULL;

   if (!display->vt->get_clipboard_text)
      return NULL;

   return display->vt->get_clipboard_text(display);
}